

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::IdentityTessellationShaderCase::
~IdentityTessellationShaderCase(IdentityTessellationShaderCase *this)

{
  ~IdentityTessellationShaderCase(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

IdentityTessellationShaderCase::~IdentityTessellationShaderCase (void)
{
	deinit();
}